

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O2

void __thiscall
optimization::inlineFunc::Inline_Func::optimize_func
          (Inline_Func *this,string *funcId,MirFunction *func,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          *funcTable)

{
  _Rb_tree_header *p_Var1;
  string *__x;
  undefined1 uVar2;
  CallInst *callInst;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *this_00;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  mapped_type *this_01;
  size_type sVar8;
  size_t sVar9;
  size_t sVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  long lVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  ulong uVar16;
  ulong uVar17;
  Tag *tag;
  Function *function;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar18;
  pointer puVar19;
  pointer puVar20;
  iterator __begin2;
  _Rb_tree_header *p_Var21;
  long lVar22;
  mapped_type sub_end_id;
  mapped_type *local_218;
  int bb_false;
  int bb_true;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_208;
  MirFunction *local_200;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_1f8;
  uint32_t local_1ec;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  end_blk_insts;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  start_blk_insts;
  undefined1 local_188 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Base_ptr local_160;
  JumpKind local_158;
  mapped_type sub_start_id;
  undefined4 uStack_14c;
  undefined8 local_148;
  undefined1 local_140;
  string *local_138;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_130;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_128;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *local_120;
  set<int,_std::less<int>,_std::allocator<int>_> base_labels;
  Rewriter rwt;
  
  local_120 = funcTable;
  bVar4 = std::operator==(&func->name,"main");
  if ((bVar4) ||
     (((func->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      is_extern != false)) {
    return;
  }
  p_Var6 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_218 = (mapped_type *)CONCAT44(local_218._4_4_,p_Var6[1]._M_color);
  base_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &base_labels._M_t._M_impl.super__Rb_tree_header._M_header;
  base_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  base_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  base_labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208 = &func->basic_blks;
  p_Var1 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  local_138 = (string *)&func->name;
  base_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       base_labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &base_labels,(int *)(p_Var6 + 1));
  }
  local_128 = &this->uninlineable_funcs;
  local_130 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->uninlined_funcs;
  local_200 = func;
LAB_0011f38f:
  p_Var7 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
LAB_0011f9bc:
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&base_labels._M_t);
      return;
    }
    if ((int)local_218 <= (int)p_Var7[1]._M_color) {
      local_1f8 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                   *)&p_Var7[3]._M_parent;
      lVar22 = 8;
      uVar17 = 0;
LAB_0011f3d2:
      p_Var6 = p_Var7[3]._M_parent;
      if ((ulong)((long)p_Var7[3]._M_left - (long)p_Var6 >> 3) <= uVar17) goto LAB_0011f3ac;
      iVar5 = (**(code **)(**(long **)(&p_Var6->_M_color + uVar17 * 2) + 8))();
      if (iVar5 == 6) {
        callInst = *(CallInst **)(&p_Var6->_M_color + uVar17 * 2);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                  ::at(local_120,&callInst->func);
        __x = &this_01->name;
        tag = (Tag *)__x;
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(local_128,__x);
        if ((sVar8 == 0) &&
           (((this_01->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->is_extern == false)) {
          sVar9 = mir::inst::MirFunction::variable_table_size(this_01);
          sVar10 = mir::inst::MirFunction::variable_table_size(local_200);
          if (sVar10 + sVar9 < 0x400) break;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_130,__x);
        }
      }
      uVar17 = uVar17 + 1;
      lVar22 = lVar22 + 8;
      goto LAB_0011f3d2;
    }
LAB_0011f3ac:
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
  sub_end_id = sub_end_id & 0xffffff00;
  AixLog::operator<<((ostream *)&sub_end_id,(Severity *)tag);
  AixLog::Tag::Tag((Tag *)local_188);
  AixLog::operator<<((ostream *)local_188,tag);
  local_148 = std::chrono::_V2::system_clock::now();
  _sub_start_id = &PTR__Timestamp_001d8f28;
  local_140 = 0;
  AixLog::operator<<((ostream *)&sub_start_id,(Timestamp *)tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&end_blk_insts,"optimize_func",(allocator<char> *)&bb_true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&start_blk_insts,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
             ,(allocator<char> *)&bb_false);
  function = (Function *)&end_blk_insts;
  AixLog::Function::Function((Function *)&rwt,(string *)function,(string *)&start_blk_insts,0x13d);
  AixLog::operator<<((ostream *)&rwt,function);
  poVar11 = std::operator<<((ostream *)&std::clog,"( inline_func ) ");
  poVar11 = std::operator<<(poVar11,local_138);
  poVar11 = std::operator<<(poVar11," inlines ");
  poVar11 = std::operator<<(poVar11,(string *)__x);
  std::endl<char,std::char_traits<char>>(poVar11);
  AixLog::Function::~Function((Function *)&rwt);
  std::__cxx11::string::~string((string *)&start_blk_insts);
  std::__cxx11::string::~string((string *)&end_blk_insts);
  AixLog::Tag::~Tag((Tag *)local_188);
  Rewriter::Rewriter(&rwt,local_200,this_01,callInst,*(int *)&p_Var7[1]._M_left);
  p_Var21 = &(this_01->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var6 = (this_01->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var21; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    Rewriter::cast_block(&rwt,(BasicBlk *)&p_Var6[1]._M_parent);
  }
  pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      (&rwt.label_cast_map,
                       (key_type *)
                       ((this_01->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                       1));
  _sub_start_id = (undefined **)CONCAT44(uStack_14c,*pmVar12);
  lVar13 = std::_Rb_tree_decrement(&p_Var21->_M_header);
  pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      (&rwt.label_cast_map,(key_type *)(lVar13 + 0x20));
  this_00 = local_208;
  sub_end_id = *pmVar12;
  local_218 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(local_208,&sub_start_id);
  end_blk_insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  end_blk_insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  end_blk_insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pmVar14 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at(this_00,&sub_end_id);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &base_labels,&sub_end_id);
  puVar20 = (pmVar14->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar19 = (pmVar14->inst).
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = rwt.init_inst_after.
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      puVar18 = rwt.init_inst_after.
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start, puVar19 != puVar20; puVar19 = puVar19 + 1
      ) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&end_blk_insts,puVar19);
  }
  for (; uVar16 = uVar17, puVar18 != puVar3; puVar18 = puVar18 + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&end_blk_insts,puVar18);
  }
  while( true ) {
    if ((ulong)((long)p_Var7[3]._M_left - (long)p_Var7[3]._M_parent >> 3) <= uVar16 + 1) break;
    puVar18 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
              ((long)&(p_Var7[3]._M_parent)->_M_color + lVar22);
    lVar22 = lVar22 + 8;
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&end_blk_insts,puVar18);
    uVar16 = uVar16 + 1;
  }
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::clear(&pmVar14->inst);
  puVar19 = end_blk_insts.
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = end_blk_insts.
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar19;
      puVar20 = puVar20 + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&pmVar14->inst,puVar20);
  }
  uVar2 = (undefined1)p_Var7[5]._M_color;
  if (uVar2 == _S_black) {
    local_1ec = *(uint32_t *)&p_Var7[4]._M_right;
  }
  local_188._8_4_ = *(undefined4 *)&p_Var7[4]._M_parent;
  local_160 = p_Var7[5]._M_parent;
  local_158 = *(JumpKind *)&p_Var7[5]._M_left;
  local_188._0_8_ = &PTR_display_001db418;
  local_170._M_local_buf[8] = uVar2 != _S_red;
  if ((bool)local_170._M_local_buf[8]) {
    local_188._16_8_ = &PTR_display_001d90d0;
    local_170._M_allocated_capacity._0_4_ = local_1ec;
  }
  mir::inst::JumpInstruction::operator=(&pmVar14->jump,(JumpInstruction *)local_188);
  bb_true = *(int *)&p_Var7[5]._M_parent;
  if (bb_true != -1) {
    pmVar15 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(local_208,&bb_true);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(pmVar15->preceding)._M_t,(key_type *)&p_Var7[1]._M_left);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &pmVar15->preceding,&pmVar14->id);
  }
  bb_false = *(int *)((long)&p_Var7[5]._M_parent + 4);
  if (bb_false != -1) {
    pmVar15 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(local_208,&bb_false);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(pmVar15->preceding)._M_t,(key_type *)&p_Var7[1]._M_left);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &pmVar15->preceding,&pmVar14->id);
  }
  start_blk_insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  start_blk_insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  start_blk_insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar22 = 0;
  while (puVar19 = rwt.init_inst_before.
                   super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, func = local_200, bVar4 = uVar17 != 0
        , uVar17 = uVar17 - 1,
        puVar18 = rwt.init_inst_before.
                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, bVar4) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&start_blk_insts,
               (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               ((long)&(*(_Base_ptr *)local_1f8)->_M_color + lVar22));
    lVar22 = lVar22 + 8;
  }
  for (; puVar18 != puVar19; puVar18 = puVar18 + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&start_blk_insts,puVar18);
  }
  puVar20 = (local_218->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar19 = (local_218->inst).
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar20;
      puVar19 = puVar19 + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&start_blk_insts,puVar19);
  }
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *)local_1f8);
  puVar19 = start_blk_insts.
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = start_blk_insts.
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar19;
      puVar20 = puVar20 + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              (local_1f8,puVar20);
  }
  local_160._0_4_ = (local_218->jump).bb_true;
  local_160._4_4_ = (local_218->jump).bb_false;
  local_188._8_4_ = (local_218->jump).kind;
  local_170._M_local_buf[8] =
       (local_218->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
       .super__Optional_payload_base<mir::inst::VarId>._M_engaged != false;
  local_158 = (local_218->jump).jump_kind;
  local_188._0_8_ = &PTR_display_001db418;
  if ((bool)local_170._M_local_buf[8]) {
    local_188._16_8_ = &PTR_display_001d90d0;
    local_170._M_allocated_capacity._0_4_ =
         (local_218->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
         _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
  }
  mir::inst::JumpInstruction::operator=
            ((JumpInstruction *)(p_Var7 + 4),(JumpInstruction *)local_188);
  std::
  _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::erase(&local_208->_M_t,&sub_start_id);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&start_blk_insts);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&end_blk_insts);
  Rewriter::~Rewriter(&rwt);
  local_218 = (mapped_type *)CONCAT44(local_218._4_4_,p_Var7[1]._M_color);
  if ((_Rb_tree_header *)p_Var7 == p_Var1) goto LAB_0011f9bc;
  goto LAB_0011f38f;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func,
                     std::map<std::string, mir::inst::MirFunction>& funcTable) {
    if (func.name == "main" || func.type->is_extern) {
      return;
    }
    int cur_blkId = func.basic_blks.begin()->first;
    std::set<mir::types::LabelId> base_labels;
    for (auto& iter : func.basic_blks) {
      base_labels.insert(iter.first);
    }
    while (true) {
      auto iter = func.basic_blks.begin();
      for (; iter != func.basic_blks.end(); ++iter) {
        bool flag = false;
        if (iter->first < cur_blkId) {
          // if (iter->first < cur_blkId || !base_labels.count(iter->first)) {

          continue;
        }
        auto& insts = iter->second.inst;
        auto& cur_blk = iter->second;
        for (int i = 0; i < insts.size(); i++) {
          auto& inst = insts[i];
          if (inst->inst_kind() != mir::inst::InstKind::Call) {
            continue;
          }
          auto& iptr = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&iptr);
          auto& subfunc = funcTable.at(callInst->func);
          if (uninlineable_funcs.count(subfunc.name)) {
            continue;
          }
          if (subfunc.type->is_extern) {
            continue;
          }
          if (subfunc.variable_table_size() + func.variable_table_size() >=
              1024) {
            uninlined_funcs.insert(subfunc.name);
            continue;
          }
          //  Then this func is inlineable
          LOG(TRACE) << "( inline_func ) " << func.name << " inlines "
                     << subfunc.name << std::endl;
          Rewriter rwt(func, subfunc, *callInst, cur_blk.id);
          for (auto& pair : subfunc.basic_blks) {
            rwt.cast_block(pair.second);
          }
          auto sub_start_id =
              rwt.label_cast_map.at(subfunc.basic_blks.begin()->first);
          auto end_iter = subfunc.basic_blks.end();
          end_iter--;
          auto sub_end_id = rwt.label_cast_map.at(end_iter->first);
          auto& start_blk = func.basic_blks.at(sub_start_id);

          std::vector<std::unique_ptr<mir::inst::Inst>> end_blk_insts;
          auto& end_blk = func.basic_blks.at(sub_end_id);
          base_labels.insert(sub_end_id);
          for (auto& j : end_blk.inst) {
            end_blk_insts.push_back(std::move(j));
          }

          for (auto& j : rwt.init_inst_after) {
            end_blk_insts.push_back(std::move(j));
          }
          for (int j = i + 1; j < insts.size(); j++) {
            end_blk_insts.push_back(std::move(insts[j]));
          }
          end_blk.inst.clear();
          for (auto& j : end_blk_insts) {
            end_blk.inst.push_back(std::move(j));
          }
          end_blk.jump = mir::inst::JumpInstruction(
              cur_blk.jump.kind, cur_blk.jump.bb_true, cur_blk.jump.bb_false,
              cur_blk.jump.cond_or_ret, cur_blk.jump.jump_kind);
          int bb_true = cur_blk.jump.bb_true;
          if (bb_true != -1) {
            auto& blk = func.basic_blks.at(bb_true);
            blk.preceding.erase(cur_blk.id);
            blk.preceding.insert(end_blk.id);
          }
          int bb_false = cur_blk.jump.bb_false;
          if (bb_false != -1) {
            auto& blk = func.basic_blks.at(bb_false);
            blk.preceding.erase(cur_blk.id);
            blk.preceding.insert(end_blk.id);
          }

          std::vector<std::unique_ptr<mir::inst::Inst>> start_blk_insts;
          for (int j = 0; j < i; j++) {
            start_blk_insts.push_back(std::move(insts[j]));
          }
          for (auto& j : rwt.init_inst_before) {
            start_blk_insts.push_back(std::move(j));
          }
          for (auto& j : start_blk.inst) {
            start_blk_insts.push_back(std::move(j));
          }
          cur_blk.inst.clear();
          for (auto& j : start_blk_insts) {
            cur_blk.inst.push_back(std::move(j));
          }
          cur_blk.jump = mir::inst::JumpInstruction(
              start_blk.jump.kind, start_blk.jump.bb_true,
              start_blk.jump.bb_false, start_blk.jump.cond_or_ret,
              start_blk.jump.jump_kind);

          flag = true;
          func.basic_blks.erase(sub_start_id);
          break;
        }
        if (flag) {
          cur_blkId = iter->first;
          break;
        }
      }
      if (iter == func.basic_blks.end()) {
        break;
      }
    }
  }